

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBase.hpp
# Opt level: O2

void __thiscall
Diligent::TextureBase<Diligent::EngineGLImplTraits>::DestroyDefaultViews
          (TextureBase<Diligent::EngineGLImplTraits> *this)

{
  void **ppvVar1;
  BIND_FLAGS BVar2;
  TextureViewGLImpl *this_00;
  RenderDeviceGLImpl *pRVar3;
  IMemoryAllocator *pIVar4;
  uint uVar5;
  FixedBlockMemoryAllocator *this_01;
  void **ppvVar6;
  ulong uVar7;
  string msg;
  string local_50;
  
  if ((void **)this->m_pDefaultViews != (void **)0x0) {
    ppvVar1 = &this->m_pDefaultViews;
    BVar2 = (this->
            super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
            ).m_Desc.BindFlags;
    uVar5 = (BVar2 & (BIND_FLAG_LAST|BIND_UNORDERED_ACCESS|BIND_DEPTH_STENCIL|BIND_RENDER_TARGET|
                     BIND_SHADER_RESOURCE)) - (BVar2 >> 1 & 0x454);
    uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333330);
    uVar5 = ((uVar5 >> 4) + uVar5 & 0xf0f0f0f) * 0x1010101 >> 0x18;
    ppvVar6 = (void **)this->m_pDefaultViews;
    if (uVar5 < 2) {
      ppvVar6 = ppvVar1;
    }
    pRVar3 = DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
             ::GetDevice(&this->
                          super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                        );
    this_01 = &(pRVar3->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_TexViewObjAllocator;
    if (this_01 != this->m_dbgTexViewObjAllocator) {
      FormatString<char[87]>
                (&local_50,
                 (char (*) [87])
                 "Texture view allocator does not match allocator provided during texture initialization"
                );
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"DestroyDefaultViews",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
                 ,0x161);
      std::__cxx11::string::~string((string *)&local_50);
    }
    for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      this_00 = (TextureViewGLImpl *)ppvVar6[uVar7];
      if (this_00 != (TextureViewGLImpl *)0x0) {
        TextureViewGLImpl::~TextureViewGLImpl(this_00);
        FixedBlockMemoryAllocator::Free(this_01,this_00);
      }
    }
    if (1 < uVar5) {
      pIVar4 = GetRawAllocator();
      (*pIVar4->_vptr_IMemoryAllocator[1])(pIVar4,*ppvVar1);
    }
    *ppvVar1 = (void *)0x0;
  }
  return;
}

Assistant:

void DestroyDefaultViews()
    {
        if (m_pDefaultViews == nullptr)
            return;

        const Uint32          NumViews       = GetNumDefaultViews();
        TextureViewImplType** ppDefaultViews = GetDefaultViewsArrayPtr();

        TexViewObjAllocatorType& TexViewAllocator = this->GetDevice()->GetTexViewObjAllocator();
        VERIFY(&TexViewAllocator == &m_dbgTexViewObjAllocator, "Texture view allocator does not match allocator provided during texture initialization");

        for (Uint32 i = 0; i < NumViews; ++i)
        {
            if (TextureViewImplType* pView = ppDefaultViews[i])
            {
                pView->~TextureViewImplType();
                TexViewAllocator.Free(pView);
            }
        }

        if (NumViews > 1)
        {
            GetRawAllocator().Free(m_pDefaultViews);
        }

        m_pDefaultViews = nullptr;
    }